

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

s_level * get_next_elemental_plane(d_level *lev)

{
  s_level *psVar1;
  s_level *psVar2;
  s_level *psVar3;
  
  if (lev->dnum == dungeon_topology.d_astral_level.dnum) {
    if (sp_levchn != (s_level *)0x0) {
      psVar1 = sp_levchn;
      psVar3 = (s_level *)0x0;
      do {
        psVar2 = psVar1;
        if ((lev->dnum == (psVar2->dlevel).dnum) && (lev->dlevel == (psVar2->dlevel).dlevel)) {
          return psVar3;
        }
        psVar1 = psVar2->next;
        psVar3 = psVar2;
      } while (psVar2->next != (s_level *)0x0);
    }
  }
  else {
    pline("get_next_elemental_plane not in Endgame.");
  }
  return (s_level *)0x0;
}

Assistant:

s_level *get_next_elemental_plane(const d_level *lev)
{
	if (!In_endgame(lev)) {
	    pline("get_next_elemental_plane not in Endgame.");
	    return NULL;
	}

	s_level *curr = find_level("astral"),
		*plane = NULL;
	for (curr = sp_levchn; curr; curr = curr->next) {
	    if (on_level(lev, &(curr->dlevel)))
		return plane;
	    plane = curr;
	}
	return NULL;
}